

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type __thiscall duckdb::Deserializer::Read<duckdb::SetScope>(Deserializer *this)

{
  SetScope SVar1;
  int iVar2;
  string str;
  char *local_28 [4];
  
  if (this->deserialize_enum_from_string == true) {
    (*this->_vptr_Deserializer[0x1a])(local_28);
    SVar1 = EnumUtil::FromString<duckdb::SetScope>(local_28[0]);
    ::std::__cxx11::string::~string((string *)local_28);
    return SVar1;
  }
  iVar2 = (*this->_vptr_Deserializer[0xf])(this);
  return (type)iVar2;
}

Assistant:

inline typename std::enable_if<std::is_enum<T>::value, T>::type Read() {
		if (deserialize_enum_from_string) {
			auto str = ReadString();
			return EnumUtil::FromString<T>(str.c_str());
		} else {
			return (T)Read<typename std::underlying_type<T>::type>();
		}
	}